

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderFieldMask
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  CodedInputStream *pCVar1;
  byte *pbVar2;
  size_type *psVar3;
  undefined1 this_00 [8];
  bool bVar4;
  uint32 tag;
  uint32 first_byte_or_zero;
  char *pcVar5;
  Field *pFVar6;
  stringpiece_ssize_type sVar7;
  uint32 uVar8;
  CodedInputStream *this_01;
  ConverterCallback *pCVar9;
  ConverterCallback *pCVar10;
  undefined8 this_02;
  StringPiece path;
  string local_f0;
  StringPiece local_d0;
  code *local_c0 [2];
  code *local_b0;
  code *local_a8;
  size_type *local_a0;
  string combined;
  undefined1 local_60 [8];
  string str;
  uint32 local_34 [2];
  uint32 buffer32;
  
  pCVar9 = (ConverterCallback *)field_name.ptr_;
  local_a0 = &combined._M_string_length;
  combined._M_dataplus._M_p = (pointer)0x0;
  combined._M_string_length._0_1_ = 0;
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  pCVar10 = pCVar9;
  combined.field_2._8_8_ = os;
  str.field_2._8_8_ = __return_storage_ptr__;
  if (pbVar2 < pCVar1->buffer_end_) {
    first_byte_or_zero = (uint32)*pbVar2;
    if (-1 < (char)*pbVar2) {
      pCVar1->buffer_ = pbVar2 + 1;
      this_01 = (CodedInputStream *)__return_storage_ptr__;
      goto LAB_00335d3c;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  this_01 = pCVar1;
  first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar1,first_byte_or_zero);
LAB_00335d3c:
  pCVar1->last_tag_ = first_byte_or_zero;
  uVar8 = 0;
  do {
    tag = first_byte_or_zero;
    psVar3 = local_a0;
    if (tag == 0) {
      sVar7 = StringPiece::CheckedSsizeTFromSizeT((size_t)combined._M_dataplus._M_p);
      this_02 = str.field_2._8_8_;
      (**(code **)(*(long *)field_name.length_ + 0x68))
                ((long *)field_name.length_,type,pCVar9,psVar3,sVar7);
      Status::Status((Status *)this_02);
LAB_00335f0d:
      std::__cxx11::string::~string((string *)&local_a0);
      return (Status *)this_02;
    }
    if (uVar8 == 0) {
      pFVar6 = FindAndVerifyField((ProtoStreamObjectSource *)this_01,(Type *)combined.field_2._8_8_,
                                  tag);
      uVar8 = 0;
      if ((pFVar6 != (Field *)0x0) && (pFVar6->number_ == 1)) {
        bVar4 = std::operator==((pFVar6->name_).ptr_,"paths");
        uVar8 = 0;
        if (bVar4) {
          uVar8 = tag;
        }
      }
    }
    if (uVar8 != tag) {
      StringPiece::StringPiece(&local_d0,"Invalid FieldMask, unexpected field.");
      this_02 = str.field_2._8_8_;
      Status::Status((Status *)str.field_2._8_8_,INTERNAL,local_d0);
      goto LAB_00335f0d;
    }
    local_60 = (undefined1  [8])&str._M_string_length;
    str._M_dataplus._M_p = (pointer)0x0;
    str._M_string_length._0_1_ = 0;
    io::CodedInputStream::ReadVarint32(this->stream_,local_34);
    io::CodedInputStream::ReadString(this->stream_,(string *)local_60,local_34[0]);
    if (combined._M_dataplus._M_p != (pointer)0x0) {
      std::__cxx11::string::append((char *)&local_a0);
    }
    this_00 = local_60;
    pcVar5 = (char *)StringPiece::CheckedSsizeTFromSizeT((size_t)str._M_dataplus._M_p);
    local_c0[1] = (code *)0x0;
    local_c0[0] = ToCamelCase_abi_cxx11_;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(google::protobuf::StringPiece)>
               ::_M_invoke;
    local_b0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(google::protobuf::StringPiece)>
               ::_M_manager;
    path.length_ = (stringpiece_ssize_type)local_c0;
    path.ptr_ = pcVar5;
    ConvertFieldMaskPath(&local_f0,(converter *)this_00,path,pCVar10);
    std::__cxx11::string::append((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::_Function_base::~_Function_base((_Function_base *)local_c0);
    this_01 = (CodedInputStream *)local_60;
    std::__cxx11::string::~string((string *)this_01);
    pCVar1 = this->stream_;
    pbVar2 = pCVar1->buffer_;
    if (pbVar2 < pCVar1->buffer_end_) {
      first_byte_or_zero = (uint32)*pbVar2;
      if ((char)*pbVar2 < '\0') goto LAB_00335e8d;
      pCVar1->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_00335e8d:
      this_01 = pCVar1;
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar1,first_byte_or_zero);
    }
    pCVar1->last_tag_ = first_byte_or_zero;
    uVar8 = tag;
  } while( true );
}

Assistant:

Status ProtoStreamObjectSource::RenderFieldMask(
    const ProtoStreamObjectSource* os, const google::protobuf::Type& type,
    StringPiece field_name, ObjectWriter* ow) {
  std::string combined;
  uint32 buffer32;
  uint32 paths_field_tag = 0;
  for (uint32 tag = os->stream_->ReadTag(); tag != 0;
       tag = os->stream_->ReadTag()) {
    if (paths_field_tag == 0) {
      const google::protobuf::Field* field = os->FindAndVerifyField(type, tag);
      if (field != nullptr && field->number() == 1 &&
          field->name() == "paths") {
        paths_field_tag = tag;
      }
    }
    if (paths_field_tag != tag) {
      return util::Status(util::error::INTERNAL,
                          "Invalid FieldMask, unexpected field.");
    }
    std::string str;
    os->stream_->ReadVarint32(&buffer32);  // string size.
    os->stream_->ReadString(&str, buffer32);
    if (!combined.empty()) {
      combined.append(",");
    }
    combined.append(ConvertFieldMaskPath(str, &ToCamelCase));
  }
  ow->RenderString(field_name, combined);
  return util::Status();
}